

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

UEnumeration * ucol_getKeywordValues_63(char *keyword,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UEnumeration *pUVar3;
  UErrorCode *status_local;
  char *keyword_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((keyword != (char *)0x0) && (iVar2 = strcmp(keyword,"collation"), iVar2 == 0)) {
      pUVar3 = ures_getKeywordValues_63("icudt63l-coll","collations",status);
      return pUVar3;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (UEnumeration *)0x0;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ucol_getKeywordValues(const char *keyword, UErrorCode *status) {
    if (U_FAILURE(*status)) {
        return NULL;
    }
    // hard-coded to accept exactly one collation keyword
    // modify if additional collation keyword is added later
    if (keyword==NULL || uprv_strcmp(keyword, KEYWORDS[0])!=0)
    {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    return ures_getKeywordValues(U_ICUDATA_COLL, RESOURCE_NAME, status);
}